

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O3

TimingControl *
slang::ast::SignalEventControl::fromExpr
          (Compilation *compilation,EdgeKind edge,Expression *expr,Expression *iffCondition,
          ASTContext *context,SourceRange sourceRange)

{
  Type *pTVar1;
  bool bVar2;
  bool bVar3;
  SignalEventControl *pSVar4;
  Symbol *pSVar5;
  Type *pTVar6;
  Diagnostic *diag;
  InvalidTimingControl *pIVar7;
  SourceLocation SVar8;
  DiagCode code;
  SourceRange sourceRange_00;
  EdgeKind local_64;
  Expression *local_60;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  char local_38;
  SourceLocation SVar9;
  
  local_64 = edge;
  local_60 = iffCondition;
  pSVar4 = BumpAllocator::
           emplace<slang::ast::SignalEventControl,slang::ast::EdgeKind&,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::SourceRange&>
                     (&compilation->super_BumpAllocator,&local_64,expr,&local_60,&sourceRange);
  bVar2 = Expression::bad(expr);
  if (bVar2) goto LAB_0029bade;
  pSVar5 = Expression::getSymbolReference(expr,true);
  if ((pSVar5 == (Symbol *)0x0) || (bVar2 = true, pSVar5->kind != ClockingBlock)) {
    bVar2 = expr->kind == ClockingEvent;
  }
  pTVar1 = (expr->type).ptr;
  if (local_64 == None) {
    if (pTVar1 == (Type *)0x0) goto LAB_0029bb03;
    bVar3 = Type::isAggregate(pTVar1);
    if (!bVar3) {
      pTVar1 = (expr->type).ptr;
      if (pTVar1 == (Type *)0x0) goto LAB_0029bb03;
      pTVar6 = pTVar1->canonical;
      if (pTVar6 == (Type *)0x0) {
        Type::resolveCanonical(pTVar1);
        pTVar6 = pTVar1->canonical;
      }
      if ((pTVar6->super_Symbol).kind != CHandleType) {
        pTVar1 = (expr->type).ptr;
        if (pTVar1 == (Type *)0x0) goto LAB_0029bb03;
        pTVar6 = pTVar1->canonical;
        if (pTVar6 == (Type *)0x0) {
          Type::resolveCanonical(pTVar1);
          pTVar6 = pTVar1->canonical;
        }
        if ((pTVar6->super_Symbol).kind != PropertyType) {
          pTVar1 = (expr->type).ptr;
          if (pTVar1 == (Type *)0x0) goto LAB_0029bb03;
          pTVar6 = pTVar1->canonical;
          if (pTVar6 == (Type *)0x0) {
            Type::resolveCanonical(pTVar1);
            pTVar6 = pTVar1->canonical;
          }
          if ((bool)((pTVar6->super_Symbol).kind != VoidType | bVar2)) goto LAB_0029b9a2;
        }
      }
    }
    SVar9 = (expr->sourceRange).startLoc;
    SVar8 = (expr->sourceRange).endLoc;
    code.subsystem = Statements;
    code.code = 0x1e;
  }
  else {
    if (pTVar1 == (Type *)0x0) goto LAB_0029bb03;
    bVar3 = Type::isIntegral(pTVar1);
    if (bVar3) {
LAB_0029b9a2:
      if ((local_60 == (Expression *)0x0) ||
         (bVar2 = ASTContext::requireBooleanConvertible(context,local_60), bVar2)) {
        ASTContext::tryEval((ConstantValue *)&local_58,context,expr);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_58);
        if (local_38 == '\0') {
          return &pSVar4->super_TimingControl;
        }
        ASTContext::addDiag(context,(DiagCode)0x4f0008,expr->sourceRange);
        return &pSVar4->super_TimingControl;
      }
      goto LAB_0029bade;
    }
    SVar9 = (expr->sourceRange).startLoc;
    SVar8 = (expr->sourceRange).endLoc;
    if (bVar2) {
      ASTContext::addDiag(context,(DiagCode)0xa0008,expr->sourceRange);
      goto LAB_0029bade;
    }
    code.subsystem = Expressions;
    code.code = 0x4b;
  }
  sourceRange_00.endLoc = SVar8;
  sourceRange_00.startLoc = SVar9;
  diag = ASTContext::addDiag(context,code,sourceRange_00);
  pTVar1 = (expr->type).ptr;
  if (pTVar1 == (Type *)0x0) {
LAB_0029bb03:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
              );
  }
  ast::operator<<(diag,pTVar1);
LAB_0029bade:
  local_58._0_8_ = pSVar4;
  pIVar7 = BumpAllocator::
           emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                     (&compilation->super_BumpAllocator,(TimingControl **)&local_58);
  return &pIVar7->super_TimingControl;
}

Assistant:

TimingControl& SignalEventControl::fromExpr(Compilation& compilation, EdgeKind edge,
                                            const Expression& expr, const Expression* iffCondition,
                                            const ASTContext& context, SourceRange sourceRange) {
    auto result = compilation.emplace<SignalEventControl>(edge, expr, iffCondition, sourceRange);
    if (expr.bad())
        return badCtrl(compilation, result);

    // Note: `expr` here can be a void-typed HierarchicalReferenceExpression if it's
    // referring to a clocking block.
    auto symRef = expr.getSymbolReference();
    bool isClocking = (symRef && symRef->kind == SymbolKind::ClockingBlock) ||
                      expr.kind == ExpressionKind::ClockingEvent;

    if (edge == EdgeKind::None) {
        if (expr.type->isAggregate() || expr.type->isCHandle() || expr.type->isPropertyType() ||
            (expr.type->isVoid() && !isClocking)) {
            context.addDiag(diag::InvalidEventExpression, expr.sourceRange) << *expr.type;
            return badCtrl(compilation, result);
        }
    }
    else if (!expr.type->isIntegral()) {
        if (isClocking)
            context.addDiag(diag::ClockingBlockEventEdge, expr.sourceRange);
        else
            context.addDiag(diag::ExprMustBeIntegral, expr.sourceRange) << *expr.type;
        return badCtrl(compilation, result);
    }

    if (iffCondition) {
        if (!context.requireBooleanConvertible(*iffCondition))
            return badCtrl(compilation, result);
    }

    // Warn if the expression is constant, since it'll never change to trigger off.
    if (context.tryEval(expr))
        context.addDiag(diag::EventExpressionConstant, expr.sourceRange);

    return *result;
}